

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

int stMain(int argc,char **argv)

{
  int iVar1;
  err_t code;
  char *pcVar2;
  u32 tests;
  octet crc [32];
  octet aoStack_88 [32];
  char local_68 [80];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  st alg\n    test cryptographic algorithms\n  st rng\n    test random number generator\n  st stamp\n    validate attached stamp\n  st crc\n    print checksum\n  st crc <prefix>\n    print checksum calculated using <prefix>\n"
           ,"st","self-testing");
    return -1;
  }
  iVar1 = strCmp(argv[1],"alg");
  if (iVar1 == 0) {
    code = 0x25b;
    if (argc != 2) goto LAB_0010cda7;
    tests = 0x1f;
  }
  else {
    iVar1 = strCmp(argv[1],"rng");
    if (iVar1 == 0) {
      code = 0x25b;
      if ((argc == 2) && (code = cmdStDo(0x10), code == 0)) {
        code = cmdRngStart(1);
      }
      goto LAB_0010cda7;
    }
    iVar1 = strCmp(argv[1],"stamp");
    if (iVar1 != 0) {
      iVar1 = strCmp(argv[1],"crc");
      code = 0x259;
      if (((iVar1 == 0) && (code = 0x25b, argc < 4)) && (code = cmdStDo(4), code == 0)) {
        if (argc == 2) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = argv[2];
        }
        code = cmdStCrc(aoStack_88,pcVar2);
        if (code == 0) {
          hexFrom(local_68,aoStack_88,0x20);
          hexLower(local_68);
          iVar1 = printf("%s\n",local_68);
          code = iVar1 >> 0x1f & 0x65;
        }
      }
      goto LAB_0010cda7;
    }
    code = 0x25b;
    if ((argc != 2) || (code = cmdStDo(1), code != 0)) goto LAB_0010cda7;
    tests = 0x2000000;
  }
  code = cmdStDo(tests);
LAB_0010cda7:
  if (((code != 0) || (iVar1 = strCmp(argv[1],"alg"), iVar1 == 0)) ||
     (iVar1 = strCmp(argv[1],"stamp"), iVar1 == 0)) {
    pcVar2 = errMsg(code);
    printf("bee2cmd/%s: %s\n","st",pcVar2);
  }
  return -(uint)(code != 0);
}

Assistant:

int stMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return stUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "alg"))
		code = stAlg(argc - 1, argv + 1);
	else if (strEq(argv[0], "rng"))
		code = stRng(argc - 1, argv + 1);
	else if (strEq(argv[0], "stamp"))
		code = stStamp(argc - 1, argv + 1);
	else if (strEq(argv[0], "crc"))
		code = stCrc(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "alg") || strEq(argv[0], "stamp"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}